

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_base_z2_row_access<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
               (void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  bool bVar1;
  reference witness;
  column_content<typename_Matrix<Column_compression_options_with_row_access<true,_(Column_types)7,_true,_false>_>::Column>
  local_278;
  reference local_248;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  allocator<unsigned_int> local_21d;
  uint i;
  iterator local_218;
  size_type local_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  allocator<unsigned_int> local_1ed;
  uint local_1ec [3];
  iterator local_1e0;
  size_type local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0;
  allocator<unsigned_int> local_1b5;
  uint local_1b4;
  iterator local_1b0;
  size_type local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  allocator<unsigned_int> local_185;
  uint local_184;
  iterator local_180;
  size_type local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  allocator<unsigned_int> local_151;
  uint local_150 [2];
  iterator local_148;
  size_type local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  allocator<unsigned_int> local_119;
  uint local_118 [2];
  iterator local_110;
  size_type local_108;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_100;
  undefined1 local_e8 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  undefined1 local_c0 [8];
  Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>
              *)local_c0,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.columnPool_,5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_e8);
  local_118[0] = 3;
  local_118[1] = 6;
  local_110 = local_118;
  local_108 = 2;
  std::allocator<unsigned_int>::allocator(&local_119);
  __l_04._M_len = local_108;
  __l_04._M_array = local_110;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_100,__l_04,&local_119);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_e8,&local_100);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_100);
  std::allocator<unsigned_int>::~allocator(&local_119);
  local_150[0] = 3;
  local_150[1] = 5;
  local_148 = local_150;
  local_140 = 2;
  std::allocator<unsigned_int>::allocator(&local_151);
  __l_03._M_len = local_140;
  __l_03._M_array = local_148;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_138,__l_03,&local_151);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_e8,&local_138);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_138);
  std::allocator<unsigned_int>::~allocator(&local_151);
  local_184 = 5;
  local_180 = &local_184;
  local_178 = 1;
  std::allocator<unsigned_int>::allocator(&local_185);
  __l_02._M_len = local_178;
  __l_02._M_array = local_180;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_170,__l_02,&local_185);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_e8,&local_170);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_170);
  std::allocator<unsigned_int>::~allocator(&local_185);
  local_1b4 = 7;
  local_1b0 = &local_1b4;
  local_1a8 = 1;
  std::allocator<unsigned_int>::allocator(&local_1b5);
  __l_01._M_len = local_1a8;
  __l_01._M_array = local_1b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1a0,__l_01,&local_1b5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_e8,&local_1a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a0);
  std::allocator<unsigned_int>::~allocator(&local_1b5);
  local_1ec[0] = 3;
  local_1ec[1] = 6;
  local_1ec[2] = 7;
  local_1e0 = local_1ec;
  local_1d8 = 3;
  std::allocator<unsigned_int>::allocator(&local_1ed);
  __l_00._M_len = local_1d8;
  __l_00._M_array = local_1e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1d0,__l_00,&local_1ed);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_e8,&local_1d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1d0);
  std::allocator<unsigned_int>::~allocator(&local_1ed);
  i = 7;
  local_218 = &i;
  local_210 = 1;
  std::allocator<unsigned_int>::allocator(&local_21d);
  __l._M_len = local_210;
  __l._M_array = local_218;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_208,__l,&local_21d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_e8,&local_208);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_208);
  std::allocator<unsigned_int>::~allocator(&local_21d);
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_e8);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_e8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&r);
    if (!bVar1) break;
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end1);
    local_248 = witness;
    get_ordered_row<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
              (&local_278,
               (Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
                *)local_c0,__range1._4_4_);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
              (witness,&local_278);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_278)
    ;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_e8);
  Gudhi::persistence_matrix::
  Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
  ::~Matrix((Matrix<Column_compression_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>
             *)local_c0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.columnPool_);
  return;
}

Assistant:

void test_base_z2_row_access() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<std::vector<unsigned int> > rows;
  if constexpr (Matrix::Option_list::has_column_compression) {
    // if the union find structure changes, the column_index values of the entries could also change. Change the test
    // with all possibilities?
    rows.push_back({3, 6});
    rows.push_back({3, 5});
    rows.push_back({5});
    rows.push_back({7});
    rows.push_back({3, 6, 7});
    rows.push_back({7});
  } else {
    rows.push_back({3, 6, 9, 10, 11});
    rows.push_back({3, 5, 8, 9, 11});
    rows.push_back({5, 8});
    rows.push_back({7});
    rows.push_back({3, 6, 7, 9, 10, 11});
    rows.push_back({7});
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}